

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmlst.cpp
# Opt level: O0

int CVmObjList::getp_count_of(vm_val_t *retval,vm_val_t *self_val,char *lst,uint *argc)

{
  int iVar1;
  size_t sVar2;
  char *in_RDX;
  vm_val_t *in_RSI;
  vm_val_t *in_RDI;
  vm_val_t ele;
  size_t val_cnt;
  size_t cnt;
  size_t idx;
  vm_val_t *val;
  vm_val_t *in_stack_ffffffffffffff98;
  uint *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  vm_val_t *in_stack_ffffffffffffffb0;
  vm_val_t *this;
  ulong local_38;
  
  if ((getp_count_of(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)::desc == '\0') &&
     (iVar1 = __cxa_guard_acquire(&getp_count_of(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)
                                   ::desc), iVar1 != 0)) {
    CVmNativeCodeDesc::CVmNativeCodeDesc(&getp_count_of::desc,1);
    __cxa_guard_release(&getp_count_of(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)::desc);
  }
  iVar1 = CVmObject::get_prop_check_argc
                    ((vm_val_t *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                     in_stack_ffffffffffffffa0,(CVmNativeCodeDesc *)in_stack_ffffffffffffff98);
  if (iVar1 == 0) {
    CVmStack::get(0);
    CVmStack::push(in_RSI);
    sVar2 = vmb_get_len((char *)0x318faa);
    this = (vm_val_t *)0x0;
    for (local_38 = 0; local_38 < sVar2; local_38 = local_38 + 1) {
      get_element_ptr_const(in_RDX,local_38);
      vmb_get_dh((char *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
      iVar1 = vm_val_t::equals(this,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
      if (iVar1 != 0) {
        this = (vm_val_t *)((long)&this->typ + 1);
      }
    }
    CVmStack::discard(2);
    vm_val_t::set_int(in_RDI,(int32_t)this);
  }
  return 1;
}

Assistant:

int CVmObjList::getp_count_of(VMG_ vm_val_t *retval,
                              const vm_val_t *self_val,
                              const char *lst, uint *argc)
{
    vm_val_t *val;
    size_t idx;
    size_t cnt;
    size_t val_cnt;
    static CVmNativeCodeDesc desc(1);

    /* check arguments */
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* get the value to find, but leave it on the stack for gc protection */
    val = G_stk->get(0);

    /* lave the self value on the stack for gc protection */
    G_stk->push(self_val);

    /* get the number of elements in the list */
    cnt = vmb_get_len(lst);

    /* scan the list and count the elements */
    for (idx = 0, val_cnt = 0 ; idx < cnt ; ++idx)
    {
        vm_val_t ele;
        
        /* re-translate the list address in case of swapping */
        VM_IF_SWAPPING_POOL(if (self_val->typ == VM_LIST)
            lst = self_val->get_as_list(vmg0_);)

        /* get this list element */
        vmb_get_dh(get_element_ptr_const(lst, idx), &ele);

        /* if it's the one we're looking for, count it */
        if (ele.equals(vmg_ val))
            ++val_cnt;
    }

    /* discard our gc protection */
    G_stk->discard(2);

    /* return the count */
    retval->set_int(val_cnt);

    /* handled */
    return TRUE;
}